

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

String * __thiscall
kj::PathPtr::toWin32StringImpl
          (String *__return_storage_ptr__,PathPtr *this,bool absolute,bool forApi)

{
  size_t sVar1;
  String *pSVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  char *pcVar6;
  undefined7 in_register_00000011;
  char (*params) [3];
  long lVar7;
  char *extraout_RDX;
  ulong uVar8;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar9;
  long lVar10;
  size_t size;
  Path *this_00;
  Path *pPVar11;
  long lVar12;
  String *p;
  String *params_2;
  size_t i;
  ArrayPtr<const_kj::String> *__range1;
  ArrayPtr<const_char> part;
  StringPtr part_00;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_77;
  DebugExpression<bool> _kjCondition_1;
  Fault f;
  char *__n;
  
  part.size_ = (char (*) [2])CONCAT71(in_register_00000011,absolute);
  sVar1 = (this->parts).size_;
  if (sVar1 == 0) {
    __kjCondition = (char *)CONCAT71(uStack_77,!absolute);
    if (absolute) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,200,FAILED,"!absolute","_kjCondition,\"absolute path is missing disk designator\""
                 ,&_kjCondition,(char (*) [41])"absolute path is missing disk designator");
      kj::_::Debug::Fault::~Fault(&f);
      str<char_const(&)[3]>(__return_storage_ptr__,(kj *)"\\\\",params);
      return __return_storage_ptr__;
    }
    str<char_const(&)[2]>(__return_storage_ptr__,(kj *)0x211a72,part.size_);
    return __return_storage_ptr__;
  }
  if (absolute) {
    pSVar2 = (this->parts).ptr;
    pPVar11 = (Path *)(pSVar2->content).size_;
    this_00 = pPVar11;
    if (pPVar11 != (Path *)0x0) {
      this_00 = (Path *)(pSVar2->content).ptr;
    }
    pcVar6 = (char *)0x0;
    if (pPVar11 != (Path *)0x0) {
      pcVar6 = (char *)((long)&pPVar11[-1].parts.disposer + 7);
    }
    if (((pcVar6 == (char *)0x2) && (*(char *)((long)&(this_00->parts).ptr + 1) == ':')) &&
       ((byte)((*(byte *)&(this_00->parts).ptr & 0xdf) + 0xbf) < 0x1a)) {
      lVar10 = 0;
    }
    else {
      part.ptr = pcVar6;
      bVar4 = Path::isNetbiosName(this_00,part);
      lVar10 = 1;
      if (!bVar4) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70],kj::String_const&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0xd6,FAILED,(char *)0x0,
                   "\"absolute win32 path must start with drive letter or netbios host name\", parts[0]"
                   ,(char (*) [70])
                    "absolute win32 path must start with drive letter or netbios host name",pSVar2);
        kj::_::Debug::Fault::fatal(&f);
      }
    }
  }
  else {
    lVar10 = 0;
    forApi = false;
  }
  uVar5 = lVar10 * 4 + 4;
  if (forApi == false) {
    uVar5 = (ulong)(uint)((int)lVar10 * 2);
  }
  size = (sVar1 + uVar5) - 1;
  lVar7 = 0;
  do {
    lVar3 = *(long *)((long)&(((this->parts).ptr)->content).size_ + lVar7);
    lVar12 = 0;
    if (lVar3 != 0) {
      lVar12 = lVar3 + -1;
    }
    size = size + lVar12;
    lVar7 = lVar7 + 0x18;
  } while (sVar1 * 0x18 != lVar7);
  heapString(__return_storage_ptr__,size);
  pcVar6 = (char *)(__return_storage_ptr__->content).size_;
  if (pcVar6 != (char *)0x0) {
    pcVar6 = (__return_storage_ptr__->content).ptr;
  }
  if (forApi == false) {
    pcVar9 = extraout_RDX;
    __kjCondition = pcVar6;
    if ((char)lVar10 == '\0') goto LAB_001f88be;
    __kjCondition = pcVar6 + 1;
    *pcVar6 = '\\';
  }
  else {
    builtin_strncpy(pcVar6,"\\\\?\\",4);
    pcVar9 = pcVar6 + 4;
    __kjCondition = pcVar9;
    if ((char)lVar10 == '\0') goto LAB_001f88be;
    *pcVar9 = 'U';
    pcVar6[5] = 'N';
    __kjCondition = pcVar6 + 7;
    pcVar6[6] = 'C';
  }
  *__kjCondition = '\\';
  __kjCondition = __kjCondition + 1;
LAB_001f88be:
  sVar1 = (this->parts).size_;
  if (sVar1 != 0) {
    params_2 = (this->parts).ptr;
    pSVar2 = params_2 + sVar1;
    bVar4 = false;
    do {
      if (bVar4) {
        *__kjCondition = '\\';
        __kjCondition = __kjCondition + 1;
      }
      sVar1 = (params_2->content).size_;
      pPVar11 = (Path *)0x237f1b;
      if (sVar1 != 0) {
        pPVar11 = (Path *)(params_2->content).ptr;
      }
      part_00.content.ptr = (char *)(sVar1 + (sVar1 == 0));
      part_00.content.size_ = (size_t)pcVar9;
      bVar4 = Path::isWin32Special(pPVar11,part_00);
      _kjCondition_1.value = !bVar4;
      if (_kjCondition_1.value) {
LAB_001f89a5:
        pcVar6 = (char *)(params_2->content).size_;
        pcVar9 = pcVar6;
        if (pcVar6 != (char *)0x0) {
          pcVar9 = (params_2->content).ptr;
        }
        __n = pcVar6 + -1;
        if (pcVar6 == (char *)0x0) {
          __n = (char *)0x0;
        }
        memcpy(__kjCondition,pcVar9,(size_t)__n);
        sVar1 = (params_2->content).size_;
        pcVar6 = (char *)(sVar1 - 1);
        if (sVar1 == 0) {
          pcVar6 = (char *)0x0;
        }
        __kjCondition = __kjCondition + (long)pcVar6;
        pcVar9 = extraout_RDX_01;
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[38],kj::String_const&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0xfd,FAILED,"!Path::isWin32Special(p)",
                   "_kjCondition,\"path cannot contain DOS reserved name\", p",&_kjCondition_1,
                   (char (*) [38])"path cannot contain DOS reserved name",params_2);
        if (1 < (params_2->content).size_) {
          uVar5 = 0;
          do {
            pcVar6 = __kjCondition + 1;
            *__kjCondition = '|';
            uVar5 = uVar5 + 1;
            sVar1 = (params_2->content).size_;
            uVar8 = 0;
            if (sVar1 != 0) {
              uVar8 = sVar1 - 1;
            }
            __kjCondition = pcVar6;
          } while (uVar5 < uVar8);
        }
        kj::_::Debug::Fault::~Fault(&f);
        pcVar9 = extraout_RDX_00;
        if (!bVar4) goto LAB_001f89a5;
      }
      params_2 = params_2 + 1;
      bVar4 = true;
    } while (params_2 != pSVar2);
  }
  sVar1 = (__return_storage_ptr__->content).size_;
  pcVar6 = (__return_storage_ptr__->content).ptr + (sVar1 - 1);
  if (sVar1 == 0) {
    pcVar6 = (char *)0x0;
  }
  if (__kjCondition == pcVar6) {
    lVar10 = 0;
    if (sVar1 != 0) {
      lVar10 = sVar1 - 1;
    }
    if (sVar1 != 0 && sVar1 - 1 != 0) {
      lVar7 = 0;
      f.exception = (Exception *)&_kjCondition;
      do {
        if (((__return_storage_ptr__->content).ptr[lVar7] == ':') &&
           ((ulong)forApi * 4 + 1 != lVar7 || !absolute)) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[80],kj::String&>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x117,FAILED,(char *)0x0,
                     "\"colons are prohibited in win32 paths to avoid triggering alternate data streams\", result"
                     ,(char (*) [80])
                      "colons are prohibited in win32 paths to avoid triggering alternate data streams"
                     ,__return_storage_ptr__);
          (__return_storage_ptr__->content).ptr[lVar7] = '|';
          kj::_::Debug::Fault::~Fault(&f);
        }
        lVar7 = lVar7 + 1;
      } while (lVar10 != lVar7);
    }
    return __return_storage_ptr__;
  }
  f.exception = (Exception *)&_kjCondition;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char*>&>
            ((Fault *)&_kjCondition_1,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x10a,FAILED,"ptr == result.end()","_kjCondition,",
             (DebugComparison<char_*&,_char_*> *)&f);
  kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1);
}

Assistant:

String PathPtr::toWin32StringImpl(bool absolute, bool forApi) const {
  if (parts.size() == 0) {
    // Special-case empty path.
    KJ_REQUIRE(!absolute, "absolute path is missing disk designator") {
      break;
    }
    return absolute ? kj::str("\\\\") : kj::str(".");
  }

  bool isUncPath = false;
  if (absolute) {
    if (Path::isWin32Drive(parts[0])) {
      // It's a win32 drive
    } else if (Path::isNetbiosName(parts[0])) {
      isUncPath = true;
    } else {
      KJ_FAIL_REQUIRE("absolute win32 path must start with drive letter or netbios host name",
                      parts[0]);
    }
  } else {
    // Currently we do nothing differently in the forApi case for relative paths.
    forApi = false;
  }

  size_t size = forApi
      ? (isUncPath ? 8 : 4) + (parts.size() - 1)
      : (isUncPath ? 2 : 0) + (parts.size() - 1);
  for (auto& p: parts) size += p.size();

  String result = heapString(size);

  char* ptr = result.begin();

  if (forApi) {
    *ptr++ = '\\';
    *ptr++ = '\\';
    *ptr++ = '?';
    *ptr++ = '\\';
    if (isUncPath) {
      *ptr++ = 'U';
      *ptr++ = 'N';
      *ptr++ = 'C';
      *ptr++ = '\\';
    }
  } else {
    if (isUncPath) {
      *ptr++ = '\\';
      *ptr++ = '\\';
    }
  }

  bool leadingSlash = false;
  for (auto& p: parts) {
    if (leadingSlash) *ptr++ = '\\';
    leadingSlash = true;

    KJ_REQUIRE(!Path::isWin32Special(p), "path cannot contain DOS reserved name", p) {
      // Recover by blotting out the name with invalid characters which Win32 syscalls will reject.
      for (size_t i = 0; i < p.size(); i++) {
        *ptr++ = '|';
      }
      goto skip;
    }

    memcpy(ptr, p.begin(), p.size());
    ptr += p.size();
  skip:;
  }

  KJ_ASSERT(ptr == result.end());

  // Check for colons (other than in drive letter), which on NTFS would be interpreted as an
  // "alternate data stream", which can lead to surprising results. If we want to support ADS, we
  // should do so using an explicit API. Note that this check also prevents a relative path from
  // appearing to start with a drive letter.
  for (size_t i: kj::indices(result)) {
    if (result[i] == ':') {
      if (absolute && i == (forApi ? 5 : 1)) {
        // False alarm: this is the drive letter.
      } else {
        KJ_FAIL_REQUIRE(
            "colons are prohibited in win32 paths to avoid triggering alternate data streams",
            result) {
          // Recover by using a different character which we know Win32 syscalls will reject.
          result[i] = '|';
          break;
        }
      }
    }
  }

  return result;
}